

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_params_util.hpp
# Opt level: O0

ParamTestSuiteInfo<CsvParamsIntTest> * __thiscall
iutest::detail::ParamTestSuiteHolder::GetTestSuitePatternHolder<CsvParamsIntTest>
          (ParamTestSuiteHolder *this,string *testsuite,string *package)

{
  ParamTestSuiteInfo<CsvParamsIntTest> *this_00;
  ParamTestSuiteInfo<CsvParamsIntTest> *local_40 [3];
  ParamTestSuiteInfo<CsvParamsIntTest> *local_28;
  ParamTestSuiteInfo<CsvParamsIntTest> *p;
  string *package_local;
  string *testsuite_local;
  ParamTestSuiteHolder *this_local;
  
  p = (ParamTestSuiteInfo<CsvParamsIntTest> *)package;
  package_local = testsuite;
  testsuite_local = (string *)this;
  local_28 = (ParamTestSuiteInfo<CsvParamsIntTest> *)
             FindTestSuitePatternHolder<std::__cxx11::string>(this,testsuite,package);
  if (local_28 == (ParamTestSuiteInfo<CsvParamsIntTest> *)0x0) {
    this_00 = (ParamTestSuiteInfo<CsvParamsIntTest> *)operator_new(0x88);
    ParamTestSuiteInfo<CsvParamsIntTest>::ParamTestSuiteInfo(this_00,package_local,(string *)p);
    local_40[0] = this_00;
    local_28 = this_00;
    std::
    vector<iutest::detail::IParamTestSuiteInfo_*,_std::allocator<iutest::detail::IParamTestSuiteInfo_*>_>
    ::push_back(&this->m_testsuite_infos,(value_type *)local_40);
  }
  return local_28;
}

Assistant:

ParamTestSuiteInfo<T>* GetTestSuitePatternHolder(const ::std::string& testsuite
        , const ::std::string& package IUTEST_APPEND_EXPLICIT_TEMPLATE_TYPE_(T) )
    {
        ParamTestSuiteInfo<T>* p = static_cast<ParamTestSuiteInfo<T>*>(FindTestSuitePatternHolder(testsuite, package));
        if( p == NULL )
        {
            p = new ParamTestSuiteInfo<T>(testsuite, package);
            m_testsuite_infos.push_back(p);
        }
        return p;
    }